

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

TRANSFER_HANDLE transfer_create(handle handle_value)

{
  int iVar1;
  TRANSFER_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  TRANSFER_INSTANCE *transfer_instance;
  
  __ptr = (TRANSFER_HANDLE)malloc(8);
  if (__ptr != (TRANSFER_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x14);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_uint(handle_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (TRANSFER_HANDLE)0x0;
}

Assistant:

TRANSFER_HANDLE transfer_create(handle handle_value)
{
    TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)malloc(sizeof(TRANSFER_INSTANCE));
    if (transfer_instance != NULL)
    {
        transfer_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(20);
        if (transfer_instance->composite_value == NULL)
        {
            free(transfer_instance);
            transfer_instance = NULL;
        }
        else
        {
            AMQP_VALUE handle_amqp_value;
            int result = 0;

            handle_amqp_value = amqpvalue_create_handle(handle_value);
            if ((result == 0) && (amqpvalue_set_composite_item(transfer_instance->composite_value, 0, handle_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(handle_amqp_value);
            if (result != 0)
            {
                transfer_destroy(transfer_instance);
                transfer_instance = NULL;
            }
        }
    }

    return transfer_instance;
}